

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::addLineBreaks
                   (string *__return_storage_ptr__,string *str,size_t columns,size_t indent)

{
  string *psVar1;
  long lVar2;
  size_type sVar3;
  string paragraph;
  ostringstream oss;
  long *local_210;
  long local_208;
  long local_200 [2];
  string *local_1f0;
  string local_1e8;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  sVar3 = 0;
  lVar2 = std::__cxx11::string::find((char)str,10);
  if (lVar2 != -1) {
    do {
      std::__cxx11::string::substr((ulong)&local_210,(ulong)str);
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e8,local_210,local_208 + (long)local_210);
      recursivelyWrapLine((ostream *)local_1a8,&local_1e8,columns,indent);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
      }
      sVar3 = lVar2 + 1;
      lVar2 = std::__cxx11::string::find((char)str,10);
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
    } while (lVar2 != -1);
  }
  psVar1 = local_1f0;
  if (str->_M_string_length != sVar3) {
    std::__cxx11::string::substr((ulong)&local_1c8,(ulong)str);
    recursivelyWrapLine((ostream *)local_1a8,&local_1c8,columns,indent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return psVar1;
}

Assistant:

inline std::string addLineBreaks( const std::string& str, std::size_t columns, std::size_t indent = 0 ) {
        std::ostringstream oss;
        std::string::size_type pos = 0;
        std::string::size_type newline = str.find_first_of( '\n' );
        while( newline != std::string::npos ) {
            std::string paragraph = str.substr( pos, newline-pos );
            recursivelyWrapLine( oss, paragraph, columns, indent );
            pos = newline+1;
            newline = str.find_first_of( '\n', pos );
        }
        if( pos != str.size() )
            recursivelyWrapLine( oss, str.substr( pos, str.size()-pos ), columns, indent );

        return oss.str();
    }